

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O2

int __thiscall
cpp_db::sqlite_parameters::bind(sqlite_parameters *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  type_index tVar4;
  sqlite3_stmt *psVar5;
  char *__s;
  size_t sVar6;
  void *pvVar7;
  void *__dest;
  long lVar8;
  undefined7 extraout_var;
  value *val;
  value *val_00;
  undefined4 in_register_00000034;
  parameter *this_00;
  ulong uVar9;
  string source;
  string local_48;
  
  this_00 = (parameter *)CONCAT44(in_register_00000034,__fd);
  if ((this_00->index < 0) || ((this_00->name)._M_string_length != 0)) {
    parameter::get_name_abi_cxx11_(&local_48,this_00);
    iVar2 = find_param_pos(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    iVar2 = parameter::get_index(this_00);
  }
  tVar4 = type_of((value *)this_00);
  bVar1 = std::type_info::operator==(tVar4._M_target,(type_info *)&int::typeinfo);
  if (bVar1) {
    psVar5 = get_stmt_handle(this);
    iVar3 = numeric_extractor<int>((value *)this_00);
    iVar3 = sqlite3_bind_int(psVar5,iVar2,iVar3);
  }
  else {
    tVar4 = type_of((value *)this_00);
    bVar1 = std::type_info::operator==(tVar4._M_target,(type_info *)&double::typeinfo);
    if (bVar1) {
      psVar5 = get_stmt_handle(this);
      numeric_extractor<double>((value *)this_00);
      iVar3 = sqlite3_bind_double(psVar5,iVar2);
    }
    else {
      tVar4 = type_of((value *)this_00);
      bVar1 = std::type_info::operator==(tVar4._M_target,(type_info *)&char_const*::typeinfo);
      if (bVar1) {
        __s = value_of<char_const*>((value *)this_00);
        sVar6 = strlen(__s);
        pvVar7 = operator_new__(sVar6 + 1);
        sVar6 = strlen(__s);
        memcpy(pvVar7,__s,sVar6 + 1);
        psVar5 = get_stmt_handle(this);
        sVar6 = strlen(__s);
        iVar3 = sqlite3_bind_text(psVar5,iVar2,pvVar7,sVar6 & 0xffffffff,delete_array<char>);
      }
      else {
        tVar4 = type_of((value *)this_00);
        bVar1 = std::type_info::operator==
                          (tVar4._M_target,(type_info *)&std::__cxx11::string::typeinfo);
        if (bVar1) {
          value_of<std::__cxx11::string>(&local_48,(cpp_db *)this_00,val);
          uVar9 = CONCAT44(local_48._M_string_length._4_4_,(int)local_48._M_string_length) + 1;
          pvVar7 = operator_new__(uVar9);
          memcpy(pvVar7,(void *)CONCAT44(local_48._M_dataplus._M_p._4_4_,
                                         (int)local_48._M_dataplus._M_p),uVar9);
          psVar5 = get_stmt_handle(this);
          sqlite3_bind_text(psVar5,iVar2,pvVar7,(int)local_48._M_string_length,delete_array<char>);
          std::__cxx11::string::~string((string *)&local_48);
          iVar3 = extraout_EAX;
        }
        else {
          tVar4 = type_of((value *)this_00);
          bVar1 = std::type_info::operator==
                            (tVar4._M_target,
                             (type_info *)
                             &std::vector<unsigned_char,std::allocator<unsigned_char>>::typeinfo);
          if (bVar1) {
            value_of<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       (cpp_db *)this_00,val_00);
            pvVar7 = (void *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p
                                     );
            uVar9 = CONCAT44(local_48._M_string_length._4_4_,(int)local_48._M_string_length) -
                    (long)pvVar7;
            __dest = operator_new__(uVar9);
            memcpy(__dest,pvVar7,uVar9);
            psVar5 = get_stmt_handle(this);
            sqlite3_bind_blob(psVar5,iVar2,__dest,
                              (int)local_48._M_string_length - (int)local_48._M_dataplus._M_p,
                              delete_array<unsigned_char>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
            iVar3 = extraout_EAX_00;
          }
          else {
            tVar4 = type_of((value *)this_00);
            bVar1 = std::type_info::operator==(tVar4._M_target,(type_info *)&long::typeinfo);
            if (bVar1) {
              psVar5 = get_stmt_handle(this);
              lVar8 = numeric_extractor<long>((value *)this_00);
              iVar3 = sqlite3_bind_int64(psVar5,iVar2,lVar8);
            }
            else {
              bVar1 = is_null((value *)this_00);
              iVar3 = (int)CONCAT71(extraout_var,bVar1);
              if (bVar1) {
                psVar5 = get_stmt_handle(this);
                iVar3 = sqlite3_bind_null(psVar5,iVar2);
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

void sqlite_parameters::bind(const parameter &param)
{
    int index = param.has_index() ? param.get_index() : find_param_pos(param.get_name());
    if (type_of(param) == typeid(int))
        sqlite3_bind_int(get_stmt_handle(), index, value_of<int>(param));
    else if (type_of(param) == typeid(double))
        sqlite3_bind_double(get_stmt_handle(), index, value_of<double>(param));
    else if (type_of(param) == typeid(const char *))
    {
        const char *source = value_of<const char *>(param);
        char * value = new char[strlen(source) + 1];
        memcpy(value, source, strlen(source) + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(strlen(source)), delete_array<char>);
    }
    else if (type_of(param) == typeid(std::string))
    {
        std::string source(value_of<std::string>(param));
        char * value = new char[source.length() + 1];
        memcpy(value, source.c_str(), source.length() + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(source.length()), delete_array<char>);
    }
    else if (type_of(param) == typeid(blob))
    {
        blob source(value_of<blob>(param));
        uint8_t *value = new uint8_t[source.size()];
        memcpy(value, source.data(), source.size());
		sqlite3_bind_blob(get_stmt_handle(), index, value, static_cast<int>(source.size()), delete_array<uint8_t>);
    }
    else if (type_of(param) == typeid(int64_t))
        sqlite3_bind_int64(get_stmt_handle(), index, value_of<int64_t>(param));
    else if (is_null(param))
		sqlite3_bind_null(get_stmt_handle(), index);
}